

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool operator==(cmListFileContext *lhs,cmListFileContext *rhs)

{
  __type _Var1;
  
  if (lhs->Line == rhs->Line) {
    _Var1 = std::operator==(&lhs->FilePath,&rhs->FilePath);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const cmListFileContext& lhs, const cmListFileContext& rhs)
{
  return lhs.Line == rhs.Line && lhs.FilePath == rhs.FilePath;
}